

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutokeyCipher.cpp
# Opt level: O0

int __thiscall
AutokeyCipher::decrypt
          (AutokeyCipher *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined4 local_2c;
  int i;
  int str_len;
  string *str_local;
  AutokeyCipher *this_local;
  string *decrypted;
  
  std::__cxx11::string::string((string *)this,(string *)out);
  iVar2 = std::__cxx11::string::length();
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)out);
    cVar1 = *pcVar4;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)ctx);
    iVar3 = ((int)cVar1 - (int)*pcVar4) + 0x1a;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
    *pcVar4 = (char)iVar3 +
              ((char)(uint)((ulong)((long)iVar3 * 0x4ec4ec4f) >> 0x23) - (char)(iVar3 >> 0x1f)) *
              -0x1a + 'a';
  }
  return (int)this;
}

Assistant:

string AutokeyCipher::decrypt(const string& str) { // Decrypt a string
    string decrypted = str;

    // Subtract key from msg (cyclic)
    int str_len = str.length();
    for(int i=0; i<str_len; ++i){
        decrypted[i] = FIRST_LETTER + (str[i] - key[i] + TOTAL_LETTERS)%TOTAL_LETTERS;
    }

    return decrypted;
}